

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O0

DecoratorDataHandle __thiscall
Rml::DecoratorTiledBox::GenerateElementData
          (DecoratorTiledBox *this,Element *element,BoxArea paint_area)

{
  int iVar1;
  code *pcVar2;
  Vector2f VVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  ComputedValues *computed_00;
  RenderManager *pRVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Texture texture;
  Mesh *local_608;
  Mesh *local_450;
  undefined1 local_430 [28];
  int i_1;
  RenderManager *render_manager;
  DecoratorTiledBoxData *data;
  Vector2f VStack_400;
  int num_textures;
  Vector2f local_3f8;
  Vector2<float> local_3f0;
  Vector2<float> local_3e8;
  Vector2f local_3e0;
  Vector2f centre_surface_dimensions;
  Vector2f centre_dimensions;
  Vector2<float> local_3c0;
  Vector2<float> local_3b8;
  Vector2f local_3b0;
  Vector2f local_3a8;
  Vector2<float> local_3a0;
  Vector2f local_398;
  Vector2f local_390;
  Vector2f local_388;
  Vector2<float> local_380;
  Vector2<float> local_378;
  Vector2f local_370;
  Vector2f local_368;
  Vector2<float> local_360;
  Vector2f local_358;
  Vector2f local_350;
  Vector2f local_348;
  Vector2<float> local_340;
  Vector2f local_338;
  Vector2f local_330;
  Vector2f local_328;
  Vector2<float> local_320;
  Vector2<float> local_318;
  Vector2f local_310;
  Vector2f local_304;
  Vector2<float> local_2fc;
  Vector2f local_2f4;
  Vector2f local_2e0;
  Vector2f local_2d8;
  Vector2f local_2d0;
  undefined1 local_2c8 [8];
  Mesh mesh [9];
  ComputedValues *computed;
  float minimum_height_1;
  float minimum_height;
  float minimum_width_1;
  float minimum_width;
  Vector2f right;
  Vector2f left;
  Vector2f bottom_right;
  Vector2f bottom;
  Vector2f bottom_left;
  Vector2f top_right;
  Vector2f top;
  Vector2f top_left;
  Vector2f natural_right;
  Vector2f natural_left;
  Vector2f natural_bottom_right;
  Vector2f natural_bottom;
  Vector2f natural_bottom_left;
  Vector2f natural_top_right;
  Vector2f natural_top;
  Vector2f natural_top_left;
  Vector2f size;
  Vector2f offset;
  RenderBox render_box;
  int local_28;
  int i;
  BoxArea paint_area_local;
  Element *element_local;
  DecoratorTiledBox *this_local;
  
  local_28 = 0;
  while( true ) {
    if (8 < local_28) {
      Element::GetRenderBox((RenderBox *)&offset,element,paint_area,0);
      size = RenderBox::GetFillOffset((RenderBox *)&offset);
      VVar3 = RenderBox::GetFillSize((RenderBox *)&offset);
      top = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x30,element);
      top_right = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x1f8,element);
      bottom_left = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x7c,element);
      bottom = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0xc8,element);
      bottom_right = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x244,element);
      left = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x114,element);
      right = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x160,element);
      _minimum_width_1 =
           DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x1ac,element);
      natural_top_left.x = VVar3.x;
      fVar4 = top.x;
      fVar11 = bottom_left.x;
      fVar12 = top.y;
      fVar6 = bottom_left.y;
      natural_right.x = right.x;
      top_left.x = minimum_width_1;
      if (natural_top_left.x < top.x + bottom_left.x) {
        fVar9 = top.x + bottom_left.x;
        top.x = natural_top_left.x * (top.x / fVar9);
        if ((fVar4 == natural_right.x) && (!NAN(fVar4) && !NAN(natural_right.x))) {
          right.x = top.x;
        }
        bottom_left.x = natural_top_left.x * (bottom_left.x / fVar9);
        if ((fVar11 == top_left.x) && (!NAN(fVar11) && !NAN(top_left.x))) {
          minimum_width_1 = bottom_left.x;
        }
      }
      fVar9 = bottom.x;
      fVar11 = left.x;
      fVar5 = bottom.y;
      fVar4 = left.y;
      if (natural_top_left.x < bottom.x + left.x) {
        fVar10 = bottom.x + left.x;
        bottom.x = natural_top_left.x * (bottom.x / fVar10);
        if ((fVar9 == natural_right.x) && (!NAN(fVar9) && !NAN(natural_right.x))) {
          right.x = bottom.x;
        }
        left.x = natural_top_left.x * (left.x / fVar10);
        if ((fVar11 == top_left.x) && (!NAN(fVar11) && !NAN(top_left.x))) {
          minimum_width_1 = left.x;
        }
      }
      natural_top_left.y = VVar3.y;
      natural_top_right.y = top_right.y;
      natural_bottom_right.y = bottom_right.y;
      if (natural_top_left.y < top.y + bottom.y) {
        fVar11 = top.y + bottom.y;
        fVar9 = natural_top_left.y * (top.y / fVar11);
        top.y = fVar9;
        if ((fVar12 == natural_top_right.y) && (!NAN(fVar12) && !NAN(natural_top_right.y))) {
          top_right.y = fVar9;
        }
        fVar11 = natural_top_left.y * (bottom.y / fVar11);
        bottom.y = fVar11;
        if ((fVar5 == natural_bottom_right.y) && (!NAN(fVar5) && !NAN(natural_bottom_right.y))) {
          bottom_right.y = fVar11;
        }
      }
      if (natural_top_left.y < bottom_left.y + left.y) {
        fVar11 = bottom_left.y + left.y;
        fVar12 = natural_top_left.y * (bottom_left.y / fVar11);
        bottom_left.y = fVar12;
        if ((fVar6 == natural_top_right.y) && (!NAN(fVar6) && !NAN(natural_top_right.y))) {
          top_right.y = fVar12;
        }
        fVar11 = natural_top_left.y * (left.y / fVar11);
        left.y = fVar11;
        if ((fVar4 == natural_bottom_right.y) && (!NAN(fVar4) && !NAN(natural_bottom_right.y))) {
          bottom_right.y = fVar11;
        }
      }
      computed_00 = Element::GetComputedValues(element);
      local_450 = (Mesh *)local_2c8;
      do {
        Mesh::Mesh(local_450);
        local_450 = local_450 + 1;
      } while (local_450 !=
               (Mesh *)&mesh[8].indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      local_2d0 = size;
      local_2d8 = top;
      local_2e0 = top;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x30,
                 (Mesh *)&mesh[(long)*(int *)&this->field_0x30 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,size,top,top);
      iVar1 = *(int *)&this->field_0x1f8;
      Vector2<float>::Vector2(&local_2fc,top.x,0.0);
      local_2f4 = Vector2<float>::operator+(&size,local_2fc);
      Vector2<float>::Vector2(&local_304,natural_top_left.x - (top.x + bottom_left.x),top_right.y);
      local_310 = top_right;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x1f8,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_2f4,local_304,
                 top_right);
      iVar1 = *(int *)&this->field_0x7c;
      Vector2<float>::Vector2(&local_320,natural_top_left.x - bottom_left.x,0.0);
      local_318 = Vector2<float>::operator+(&size,local_320);
      local_328 = bottom_left;
      local_330 = bottom_left;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x7c,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_318,
                 bottom_left,bottom_left);
      iVar1 = *(int *)&this->field_0x160;
      Vector2<float>::Vector2(&local_340,0.0,top.y);
      local_338 = Vector2<float>::operator+(&size,local_340);
      Vector2<float>::Vector2(&local_348,right.x,natural_top_left.y - (top.y + bottom.y));
      local_350 = right;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x160,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_338,local_348,
                 right);
      iVar1 = *(int *)&this->field_0x1ac;
      Vector2<float>::Vector2(&local_360,natural_top_left.x - minimum_width_1,bottom_left.y);
      local_358 = Vector2<float>::operator+(&size,local_360);
      Vector2<float>::Vector2
                (&local_368,minimum_width_1,natural_top_left.y - (bottom_left.y + left.y));
      local_370 = _minimum_width_1;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x1ac,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_358,local_368,
                 _minimum_width_1);
      iVar1 = *(int *)&this->field_0xc8;
      Vector2<float>::Vector2(&local_380,0.0,natural_top_left.y - bottom.y);
      local_378 = Vector2<float>::operator+(&size,local_380);
      local_388 = bottom;
      local_390 = bottom;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0xc8,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_378,bottom,
                 bottom);
      iVar1 = *(int *)&this->field_0x244;
      Vector2<float>::Vector2(&local_3a0,bottom.x,natural_top_left.y - bottom_right.y);
      local_398 = Vector2<float>::operator+(&size,local_3a0);
      Vector2<float>::Vector2(&local_3a8,natural_top_left.x - (bottom.x + left.x),bottom_right.y);
      local_3b0 = bottom_right;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x244,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_398,local_3a8,
                 bottom_right);
      iVar1 = *(int *)&this->field_0x114;
      Vector2<float>::Vector2(&local_3c0,natural_top_left.x - left.x,natural_top_left.y - left.y);
      local_3b8 = Vector2<float>::operator+(&size,local_3c0);
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x114,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_3b8,left,left)
      ;
      centre_surface_dimensions =
           DecoratorTiled::Tile::GetNaturalDimensions((Tile *)&this->field_0x290,element);
      Vector2<float>::Vector2
                (&local_3e0,natural_top_left.x - (right.x + minimum_width_1),
                 natural_top_left.y - (top_right.y + bottom_right.y));
      iVar1 = *(int *)&this->field_0x290;
      Vector2<float>::Vector2(&local_3f0,right.x,top_right.y);
      local_3e8 = Vector2<float>::operator+(&size,local_3f0);
      local_3f8 = local_3e0;
      VStack_400 = centre_surface_dimensions;
      DecoratorTiled::Tile::GenerateGeometry
                ((Tile *)&this->field_0x290,
                 (Mesh *)&mesh[(long)iVar1 + -1].indices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,computed_00,local_3e8,local_3e0,
                 centre_surface_dimensions);
      data._4_4_ = Decorator::GetNumTextures((Decorator *)this);
      pRVar8 = (RenderManager *)operator_new(0x10);
      DecoratorTiledBoxData::DecoratorTiledBoxData((DecoratorTiledBoxData *)pRVar8,data._4_4_);
      render_manager = pRVar8;
      register0x00000000 = Element::GetRenderManager(element);
      for (local_430._20_4_ = 0; pRVar8 = render_manager, (int)local_430._20_4_ < data._4_4_;
          local_430._20_4_ = local_430._20_4_ + 1) {
        RenderManager::MakeGeometry((RenderManager *)local_430,(Mesh *)stack0xfffffffffffffbe8);
        Geometry::operator=((Geometry *)
                            ((long)&(((render_manager->geometry_list).elements.
                                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->mesh).vertices +
                            (long)(int)local_430._20_4_ * 0x10),(Geometry *)local_430);
        Geometry::~Geometry((Geometry *)local_430);
      }
      local_608 = (Mesh *)&mesh[8].indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      do {
        local_608 = local_608 + -1;
        Mesh::~Mesh(local_608);
      } while (local_608 != (Mesh *)local_2c8);
      return (DecoratorDataHandle)pRVar8;
    }
    if ((*(int *)(&this->field_0x30 + (long)local_28 * 0x4c) < 0) &&
       (bVar7 = Assert("RMLUI_ASSERT(tiles[i].texture_index >= 0)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiledBox.cpp"
                       ,0x68), !bVar7)) break;
    texture = Decorator::GetTexture
                        ((Decorator *)this,*(int *)(&this->field_0x30 + (long)local_28 * 0x4c));
    DecoratorTiled::Tile::CalculateDimensions
              ((Tile *)(&this->field_0x30 + (long)local_28 * 0x4c),texture);
    local_28 = local_28 + 1;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

DecoratorDataHandle DecoratorTiledBox::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tiles for this element.
	for (int i = 0; i < 9; i++)
	{
		RMLUI_ASSERT(tiles[i].texture_index >= 0);
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));
	}

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	// Calculate the natural dimensions of tile corners and edges.
	const Vector2f natural_top_left = tiles[TOP_LEFT_CORNER].GetNaturalDimensions(element);
	const Vector2f natural_top = tiles[TOP_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_top_right = tiles[TOP_RIGHT_CORNER].GetNaturalDimensions(element);

	const Vector2f natural_bottom_left = tiles[BOTTOM_LEFT_CORNER].GetNaturalDimensions(element);
	const Vector2f natural_bottom = tiles[BOTTOM_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_bottom_right = tiles[BOTTOM_RIGHT_CORNER].GetNaturalDimensions(element);

	const Vector2f natural_left = tiles[LEFT_EDGE].GetNaturalDimensions(element);
	const Vector2f natural_right = tiles[RIGHT_EDGE].GetNaturalDimensions(element);

	// Initialize the to-be-determined dimensions of the tiles.
	Vector2f top_left = natural_top_left;
	Vector2f top = natural_top;
	Vector2f top_right = natural_top_right;

	Vector2f bottom_left = natural_bottom_left;
	Vector2f bottom = natural_bottom;
	Vector2f bottom_right = natural_bottom_right;

	Vector2f left = natural_left;
	Vector2f right = natural_right;

	// Scale the top corners down if appropriate. If they are scaled, then the left and right edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.x < top_left.x + top_right.x)
	{
		float minimum_width = top_left.x + top_right.x;

		top_left.x = size.x * (top_left.x / minimum_width);
		if (natural_top_left.x == natural_left.x)
			left.x = top_left.x;

		top_right.x = size.x * (top_right.x / minimum_width);
		if (natural_top_right.x == natural_right.x)
			right.x = top_right.x;
	}

	// Scale the bottom corners down if appropriate. If they are scaled, then the left and right edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.x < bottom_left.x + bottom_right.x)
	{
		float minimum_width = bottom_left.x + bottom_right.x;

		bottom_left.x = size.x * (bottom_left.x / minimum_width);
		if (natural_bottom_left.x == natural_left.x)
			left.x = bottom_left.x;

		bottom_right.x = size.x * (bottom_right.x / minimum_width);
		if (natural_bottom_right.x == natural_right.x)
			right.x = bottom_right.x;
	}

	// Scale the left corners down if appropriate. If they are scaled, then the top and bottom edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.y < top_left.y + bottom_left.y)
	{
		float minimum_height = top_left.y + bottom_left.y;

		top_left.y = size.y * (top_left.y / minimum_height);
		if (natural_top_left.y == natural_top.y)
			top.y = top_left.y;

		bottom_left.y = size.y * (bottom_left.y / minimum_height);
		if (natural_bottom_left.y == natural_bottom.y)
			bottom.y = bottom_left.y;
	}

	// Scale the right corners down if appropriate. If they are scaled, then the top and bottom edges are also scaled
	// if they shared a width with their corner. Best solution? Don't know.
	if (size.y < top_right.y + bottom_right.y)
	{
		float minimum_height = top_right.y + bottom_right.y;

		top_right.y = size.y * (top_right.y / minimum_height);
		if (natural_top_right.y == natural_top.y)
			top.y = top_right.y;

		bottom_right.y = size.y * (bottom_right.y / minimum_height);
		if (natural_bottom_right.y == natural_bottom.y)
			bottom.y = bottom_right.y;
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	// Generate the geometry for the top-left tile.
	tiles[TOP_LEFT_CORNER].GenerateGeometry(mesh[tiles[TOP_LEFT_CORNER].texture_index], computed, offset, top_left, top_left);
	// Generate the geometry for the top edge tiles.
	tiles[TOP_EDGE].GenerateGeometry(mesh[tiles[TOP_EDGE].texture_index], computed, offset + Vector2f(top_left.x, 0),
		Vector2f(size.x - (top_left.x + top_right.x), top.y), top);
	// Generate the geometry for the top-right tile.
	tiles[TOP_RIGHT_CORNER].GenerateGeometry(mesh[tiles[TOP_RIGHT_CORNER].texture_index], computed, offset + Vector2f(size.x - top_right.x, 0),
		top_right, top_right);

	// Generate the geometry for the left side.
	tiles[LEFT_EDGE].GenerateGeometry(mesh[tiles[LEFT_EDGE].texture_index], computed, offset + Vector2f(0, top_left.y),
		Vector2f(left.x, size.y - (top_left.y + bottom_left.y)), left);

	// Generate the geometry for the right side.
	tiles[RIGHT_EDGE].GenerateGeometry(mesh[tiles[RIGHT_EDGE].texture_index], computed, offset + Vector2f((size.x - right.x), top_right.y),
		Vector2f(right.x, size.y - (top_right.y + bottom_right.y)), right);

	// Generate the geometry for the bottom-left tile.
	tiles[BOTTOM_LEFT_CORNER].GenerateGeometry(mesh[tiles[BOTTOM_LEFT_CORNER].texture_index], computed, offset + Vector2f(0, size.y - bottom_left.y),
		bottom_left, bottom_left);
	// Generate the geometry for the bottom edge tiles.
	tiles[BOTTOM_EDGE].GenerateGeometry(mesh[tiles[BOTTOM_EDGE].texture_index], computed, offset + Vector2f(bottom_left.x, size.y - bottom.y),
		Vector2f(size.x - (bottom_left.x + bottom_right.x), bottom.y), bottom);
	// Generate the geometry for the bottom-right tile.
	tiles[BOTTOM_RIGHT_CORNER].GenerateGeometry(mesh[tiles[BOTTOM_RIGHT_CORNER].texture_index], computed,
		offset + Vector2f(size.x - bottom_right.x, size.y - bottom_right.y), bottom_right, bottom_right);

	// Generate the centre geometry.
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);
	Vector2f centre_surface_dimensions(size.x - (left.x + right.x), size.y - (top.y + bottom.y));

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(left.x, top.y), centre_surface_dimensions,
		centre_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledBoxData* data = new DecoratorTiledBoxData(num_textures);
	RenderManager* render_manager = element->GetRenderManager();

	// Set the mesh and textures on the geometry.
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}